

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O0

void scalar_getrect(t_gobj *z,_glist *owner,int *xp1,int *yp1,int *xp2,int *yp2)

{
  t_float tVar1;
  int local_88;
  int local_84;
  int ny2;
  int nx2;
  int ny1;
  int nx1;
  _parentwidgetbehavior *wb;
  t_float basey;
  t_float basex;
  t_gobj *y;
  int y2;
  int y1;
  int x2;
  int x1;
  _glist *templatecanvas;
  t_template *template;
  t_scalar *x;
  int *yp2_local;
  int *xp2_local;
  int *yp1_local;
  int *xp1_local;
  _glist *owner_local;
  t_gobj *z_local;
  
  template = (t_template *)z;
  x = (t_scalar *)yp2;
  yp2_local = xp2;
  xp2_local = yp1;
  yp1_local = xp1;
  xp1_local = (int *)owner;
  owner_local = (_glist *)z;
  templatecanvas = (_glist *)template_findbyname((t_symbol *)z[1].g_pd);
  _x2 = template_findcanvas((t_template *)templatecanvas);
  y1 = 0x7fffffff;
  y2 = -0x7fffffff;
  y._4_4_ = 0x7fffffff;
  y._0_4_ = 0x80000001;
  scalar_getbasexy((t_scalar *)template,(t_float *)((long)&wb + 4),(t_float *)&wb);
  if (_x2 == (_glist *)0x0) {
    tVar1 = glist_xtopixels((_glist *)xp1_local,wb._4_4_);
    y2 = (int)tVar1;
    y1 = y2;
    tVar1 = glist_ytopixels((_glist *)xp1_local,wb._0_4_);
    y._0_4_ = (int)tVar1;
    y._4_4_ = (int)y;
  }
  else {
    y._4_4_ = 0x7fffffff;
    y1 = 0x7fffffff;
    y._0_4_ = -0x7fffffff;
    y2 = -0x7fffffff;
    for (_basey = _x2->gl_list; _basey != (t_gobj *)0x0; _basey = _basey->g_next) {
      _ny1 = pd_getparentwidget(&_basey->g_pd);
      if (_ny1 != (_parentwidgetbehavior *)0x0) {
        (*_ny1->w_parentgetrectfn)
                  (_basey,(_glist *)xp1_local,(t_word *)&template->t_n,(t_template *)templatecanvas,
                   wb._4_4_,wb._0_4_,&nx2,&ny2,&local_84,&local_88);
        if (nx2 < y1) {
          y1 = nx2;
        }
        if (ny2 < y._4_4_) {
          y._4_4_ = ny2;
        }
        if (y2 < local_84) {
          y2 = local_84;
        }
        if ((int)y < local_88) {
          y._0_4_ = local_88;
        }
      }
    }
    if ((y2 < y1) || ((int)y < y._4_4_)) {
      y._0_4_ = 0;
      y2 = 0;
      y._4_4_ = 0;
      y1 = 0;
    }
  }
  *yp1_local = y1;
  *xp2_local = y._4_4_;
  *yp2_local = y2;
  *(int *)&(x->sc_gobj).g_pd = (int)y;
  return;
}

Assistant:

static void scalar_getrect(t_gobj *z, t_glist *owner,
    int *xp1, int *yp1, int *xp2, int *yp2)
{
    t_scalar *x = (t_scalar *)z;
    t_template *template = template_findbyname(x->sc_template);
    t_canvas *templatecanvas = template_findcanvas(template);
    int x1 = 0x7fffffff, x2 = -0x7fffffff, y1 = 0x7fffffff, y2 = -0x7fffffff;
    t_gobj *y;
    t_float basex, basey;
    scalar_getbasexy(x, &basex, &basey);
        /* if someone deleted the template canvas, we're just a point */
    if (!templatecanvas)
    {
        x1 = x2 = glist_xtopixels(owner, basex);
        y1 = y2 = glist_ytopixels(owner, basey);
    }
    else
    {
        x1 = y1 = 0x7fffffff;
        x2 = y2 = -0x7fffffff;
        for (y = templatecanvas->gl_list; y; y = y->g_next)
        {
            const t_parentwidgetbehavior *wb = pd_getparentwidget(&y->g_pd);
            int nx1, ny1, nx2, ny2;
            if (!wb) continue;
            (*wb->w_parentgetrectfn)(y, owner,
                x->sc_vec, template, basex, basey,
                &nx1, &ny1, &nx2, &ny2);
            if (nx1 < x1) x1 = nx1;
            if (ny1 < y1) y1 = ny1;
            if (nx2 > x2) x2 = nx2;
            if (ny2 > y2) y2 = ny2;
        }
        if (x2 < x1 || y2 < y1)
            x1 = y1 = x2 = y2 = 0;
    }
    /* post("scalar x1 %d y1 %d x2 %d y2 %d", x1, y1, x2, y2); */
    *xp1 = x1;
    *yp1 = y1;
    *xp2 = x2;
    *yp2 = y2;
}